

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::addCPackStandardDocSections(cmDocumentation *this)

{
  undefined1 local_48 [8];
  cmDocumentationSection sec;
  cmDocumentation *this_local;
  
  sec.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cmDocumentationSection::cmDocumentationSection((cmDocumentationSection *)local_48,"Generators");
  cmDocumentationSection::Append
            ((cmDocumentationSection *)local_48,cmDocumentationCPackGeneratorsHeader);
  std::
  map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::emplace<char_const(&)[11],cmDocumentationSection>
            ((map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [11])0x768339,(cmDocumentationSection *)local_48);
  cmDocumentationSection::~cmDocumentationSection((cmDocumentationSection *)local_48);
  return;
}

Assistant:

void cmDocumentation::addCPackStandardDocSections()
{
  cmDocumentationSection sec{ "Generators" };
  sec.Append(cmDocumentationCPackGeneratorsHeader);
  this->AllSections.emplace("Generators", std::move(sec));
}